

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O2

bool __thiscall UnifiedRegex::OctoquadIdentifier::UnionChar(OctoquadIdentifier *this,Char c)

{
  char *pcVar1;
  int iVar2;
  
  if (7 < this->currPatternLength) {
    return false;
  }
  if (((uint)this->currPatternNum < 2) && (iVar2 = GetOrAddCharCode(this,c), -1 < iVar2)) {
    pcVar1 = this->patternBits[this->currPatternNum] + this->currPatternLength;
    *pcVar1 = *pcVar1 | (byte)(1 << ((byte)iVar2 & 0x1f));
    return true;
  }
  return false;
}

Assistant:

bool OctoquadIdentifier::UnionChar(Char c)
    {
        if (currPatternLength >= TrigramInfo::PatternLength || currPatternNum < 0 || currPatternNum >= NumPatterns)
            return false;
        int code = GetOrAddCharCode(c);
        if (code < 0)
            return false;
        patternBits[currPatternNum][currPatternLength] |= 1 << code;
        return true;
    }